

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.h
# Opt level: O1

void __thiscall SynBase::SynBase(SynBase *this,uint typeID,Lexeme *begin,Lexeme *end)

{
  char *pcVar1;
  char *pcVar2;
  
  this->_vptr_SynBase = (_func_int **)&PTR__SynBase_002282e8;
  this->typeID = typeID;
  this->begin = begin;
  this->end = end;
  if (begin == (Lexeme *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = begin->pos;
  }
  if (end == (Lexeme *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = end->pos + end->length;
  }
  if (pcVar1 <= pcVar2) {
    (this->pos).begin = pcVar1;
    (this->pos).end = pcVar2;
    this->next = (SynBase *)0x0;
    this->listed = false;
    this->isInternal = false;
    return;
  }
  __assert_fail("strEnd >= strBegin",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/StrAlgo.h"
                ,0x28,"InplaceStr::InplaceStr(const char *, const char *)");
}

Assistant:

SynBase(unsigned typeID, Lexeme *begin, Lexeme *end): typeID(typeID), begin(begin), end(end), pos(begin ? begin->pos : 0, end ? end->pos + end->length : 0), next(0), listed(false), isInternal(false)
	{
	}